

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O3

void __thiscall DRotatePoly::Tick(DRotatePoly *this)

{
  bool bVar1;
  long lVar2;
  FPolyObj *this_00;
  double dVar3;
  DAngle local_18;
  
  lVar2 = (long)po_NumPolyobjs;
  if (0 < lVar2) {
    this_00 = polyobjs;
    do {
      if (this_00->tag == (this->super_DPolyAction).m_PolyObj) {
        local_18.Degrees = (this->super_DPolyAction).m_Speed;
        dVar3 = (this->super_DPolyAction).m_Dist;
        if (((dVar3 != -1.0) || (NAN(dVar3))) && (dVar3 < ABS(local_18.Degrees))) {
          local_18.Degrees =
               (double)(~-(ulong)(local_18.Degrees < 0.0) & (ulong)dVar3 |
                       (ulong)-dVar3 & -(ulong)(local_18.Degrees < 0.0));
          (this->super_DPolyAction).m_Speed = local_18.Degrees;
        }
        bVar1 = FPolyObj::RotatePolyobj(this_00,&local_18,false);
        if (!bVar1) {
          return;
        }
        dVar3 = (this->super_DPolyAction).m_Dist;
        if ((dVar3 == -1.0) && (!NAN(dVar3))) {
          return;
        }
        dVar3 = dVar3 - ABS((this->super_DPolyAction).m_Speed);
        (this->super_DPolyAction).m_Dist = dVar3;
        if (dVar3 != 0.0) {
          return;
        }
        if (NAN(dVar3)) {
          return;
        }
        SN_StopSequence(this_00);
        (*(this->super_DPolyAction).super_DThinker.super_DObject._vptr_DObject[4])(this);
        return;
      }
      this_00 = this_00 + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  return;
}

Assistant:

void DRotatePoly::Tick ()
{
	FPolyObj *poly = PO_GetPolyobj (m_PolyObj);
	if (poly == NULL) return;

	// Don't let non-perpetual polyobjs overshoot their targets.
	if (m_Dist != -1 && m_Dist < fabs(m_Speed))
	{
		m_Speed = m_Speed < 0 ? -m_Dist : m_Dist;
	}

	if (poly->RotatePolyobj (m_Speed))
	{
		if (m_Dist == -1)
		{ // perpetual polyobj
			return;
		}
		m_Dist -= fabs(m_Speed);
		if (m_Dist == 0)
		{
			SN_StopSequence (poly);
			Destroy ();
		}
	}
}